

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

iterator __thiscall cmComputeLinkDepends::AllocateLinkEntry(cmComputeLinkDepends *this,string *item)

{
  pointer *pppDVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer pcVar6;
  iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar7;
  value_type index_entry;
  LinkEntry local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_50;
  
  pLVar4 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar5 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = &local_50.first.field_2;
  pcVar6 = (item->_M_dataplus)._M_p;
  local_50.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar6,pcVar6 + item->_M_string_length);
  local_50.second = (int)((ulong)((long)pLVar4 - (long)pLVar5) >> 4) * -0x55555555;
  pVar7 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string_const,int>&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&this->LinkEntryIndex,&local_50);
  paVar3 = &local_88.Item.field_2;
  local_88.Item._M_string_length = 0;
  local_88.Item.field_2._M_allocated_capacity =
       local_88.Item.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_88.Target = (cmTarget *)0x0;
  local_88.IsSharedDep = false;
  local_88.IsFlag = false;
  local_88.Item._M_dataplus._M_p = (pointer)paVar3;
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  emplace_back<cmComputeLinkDepends::LinkEntry>(&this->EntryList,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.Item._M_dataplus._M_p != paVar3) {
    operator_delete(local_88.Item._M_dataplus._M_p,local_88.Item.field_2._M_allocated_capacity + 1);
  }
  local_88.Item._M_dataplus._M_p = (pointer)0x0;
  __position._M_current =
       (this->InferredDependSets).
       super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->InferredDependSets).
      super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>
    ::_M_realloc_insert<cmComputeLinkDepends::DependSetList*>
              ((vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>
                *)&this->InferredDependSets,__position,(DependSetList **)&local_88);
  }
  else {
    *__position._M_current = (DependSetList *)0x0;
    pppDVar1 = &(this->InferredDependSets).
                super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppDVar1 = *pppDVar1 + 1;
  }
  local_88.Item._M_dataplus._M_p = (pointer)0x0;
  local_88.Item._M_string_length = 0;
  local_88.Item.field_2._M_allocated_capacity = 0;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::emplace_back<cmGraphEdgeList>
            (&(this->EntryConstraintGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             (cmGraphEdgeList *)&local_88);
  if (local_88.Item._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_88.Item._M_dataplus._M_p,
                    local_88.Item.field_2._M_allocated_capacity -
                    (long)local_88.Item._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  return (iterator)pVar7.first._M_node._M_node;
}

Assistant:

std::map<std::string, int>::iterator
cmComputeLinkDepends::AllocateLinkEntry(std::string const& item)
{
  std::map<std::string, int>::value_type
    index_entry(item, static_cast<int>(this->EntryList.size()));
  std::map<std::string, int>::iterator
    lei = this->LinkEntryIndex.insert(index_entry).first;
  this->EntryList.push_back(LinkEntry());
  this->InferredDependSets.push_back(0);
  this->EntryConstraintGraph.push_back(EdgeList());
  return lei;
}